

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::Add
          (EncodedDescriptorDatabase *this,void *encoded_file_descriptor,int size)

{
  bool bVar1;
  LogMessage *other;
  Value value;
  FileDescriptorProto file;
  LogFinisher local_131;
  LogMessage local_130;
  FileDescriptorProto local_f8;
  
  FileDescriptorProto::FileDescriptorProto(&local_f8,(Arena *)0x0,false);
  bVar1 = MessageLite::ParseFromArray((MessageLite *)&local_f8,encoded_file_descriptor,size);
  if (bVar1) {
    value.second = size;
    value.first = encoded_file_descriptor;
    value._12_4_ = 0;
    bVar1 = DescriptorIndex::AddFile<google::protobuf::FileDescriptorProto>
                      ((this->index_)._M_t.
                       super___uniq_ptr_impl<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex,_std::default_delete<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex_*,_std::default_delete<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex>_>
                       .
                       super__Head_base<0UL,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex_*,_false>
                       ._M_head_impl,&local_f8,value);
  }
  else {
    internal::LogMessage::LogMessage
              (&local_130,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
               ,0x22f);
    other = internal::LogMessage::operator<<
                      (&local_130,
                       "Invalid file descriptor data passed to EncodedDescriptorDatabase::Add().");
    internal::LogFinisher::operator=(&local_131,other);
    internal::LogMessage::~LogMessage(&local_130);
    bVar1 = false;
  }
  FileDescriptorProto::~FileDescriptorProto(&local_f8);
  return bVar1;
}

Assistant:

bool EncodedDescriptorDatabase::Add(const void* encoded_file_descriptor,
                                    int size) {
  FileDescriptorProto file;
  if (file.ParseFromArray(encoded_file_descriptor, size)) {
    return index_->AddFile(file, std::make_pair(encoded_file_descriptor, size));
  } else {
    GOOGLE_LOG(ERROR) << "Invalid file descriptor data passed to "
                  "EncodedDescriptorDatabase::Add().";
    return false;
  }
}